

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_26::BinaryReader::ReadBytes
          (BinaryReader *this,void **out_data,Address *out_data_size,char *desc)

{
  Result RVar1;
  Enum EVar2;
  uint32_t data_size;
  
  data_size = 0;
  RVar1 = ReadU32Leb128(this,&data_size,"data size");
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    RVar1 = ReadBytesWithSize(this,out_data,(ulong)data_size,desc);
    if (RVar1.enum_ != Error) {
      *out_data_size = (ulong)data_size;
      EVar2 = Ok;
    }
  }
  return (Result)EVar2;
}

Assistant:

Result BinaryReader::ReadBytes(const void** out_data,
                               Address* out_data_size,
                               const char* desc) {
  uint32_t data_size = 0;
  CHECK_RESULT(ReadU32Leb128(&data_size, "data size"));
  CHECK_RESULT(ReadBytesWithSize(out_data, data_size, desc));
  *out_data_size = data_size;
  return Result::Ok;
}